

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_sral_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t n_local;
  uint64_t x_local;
  CPUARMState *env_local;
  
  uVar1 = (ulong)(long)(int)x >> ((byte)n & 0x3f);
  uVar2 = uVar1 & 0xffffffff;
  uVar4 = (ulong)(long)(int)(x >> 0x20) >> ((byte)n & 0x3f);
  uVar3 = uVar4 << 0x20;
  (env->iwmmxt).cregs[3] =
       (uint)((uVar1 & 0x80000000) != 0) << 0xf | (uint)(uVar2 == 0) << 0xe |
       (uint)((uVar3 & 0x8000000000000000) != 0) << 0x1f | (uint)((uVar4 & 0xffffffff) == 0) << 0x1e
  ;
  return uVar2 | uVar3;
}

Assistant:

uint64_t HELPER(iwmmxt_sral)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((EXTEND32(x >> 0) >> n) & 0xffffffff) << 0) |
        (((EXTEND32(x >> 32) >> n) & 0xffffffff) << 32);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}